

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::StencilClearValueTestCase::test
          (StencilClearValueTestCase *this)

{
  RenderTarget *pRVar1;
  int iVar2;
  int iVar3;
  uint s;
  
  iVar2 = 0;
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb91,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  pRVar1 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  iVar3 = pRVar1->m_stencilBits;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != iVar2; iVar2 = iVar2 + 1) {
    s = 1 << ((byte)iVar2 & 0x1f);
    glu::CallLogWrapper::glClearStencil(&(this->super_ApiCase).super_CallLogWrapper,s);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb91,
               (ulong)s);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, GL_STENCIL_CLEAR_VALUE, 0);
		expectError(GL_NO_ERROR);

		const int stencilBits = m_context.getRenderTarget().getStencilBits();

		for (int stencilBit = 0; stencilBit < stencilBits; ++stencilBit)
		{
			const int ref = 1 << stencilBit;

			glClearStencil(ref);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, GL_STENCIL_CLEAR_VALUE, ref);
			expectError(GL_NO_ERROR);
		}
	}